

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int vdbeCompareMemString(Mem *pMem1,Mem *pMem2,CollSeq *pColl,u8 *prcErr)

{
  int iVar1;
  void *pvVar2;
  void *pvVar3;
  Mem c2;
  Mem c1;
  Mem local_a0;
  Mem local_68;
  
  if (pMem1->enc == pColl->enc) {
    iVar1 = (*pColl->xCmp)(pColl->pUser,pMem1->n,pMem1->z,pMem2->n,pMem2->z);
    return iVar1;
  }
  local_a0.db = pMem1->db;
  local_68.flags = 1;
  local_68.szMalloc = 0;
  local_a0.flags = 1;
  local_a0.szMalloc = 0;
  local_68.db = local_a0.db;
  sqlite3VdbeMemShallowCopy(&local_68,pMem1,0x4000);
  sqlite3VdbeMemShallowCopy(&local_a0,pMem2,0x4000);
  pvVar2 = sqlite3ValueText(&local_68,pColl->enc);
  pvVar3 = sqlite3ValueText(&local_a0,pColl->enc);
  if (pvVar3 == (void *)0x0 || pvVar2 == (void *)0x0) {
    iVar1 = 0;
    if (prcErr != (u8 *)0x0) {
      *prcErr = '\a';
      iVar1 = 0;
    }
  }
  else {
    iVar1 = (*pColl->xCmp)(pColl->pUser,local_68.n,pvVar2,local_a0.n,pvVar3);
  }
  if (local_68.szMalloc != 0) {
    vdbeMemClear(&local_68);
  }
  if (local_a0.szMalloc != 0) {
    vdbeMemClear(&local_a0);
  }
  return iVar1;
}

Assistant:

static int vdbeCompareMemString(
  const Mem *pMem1,
  const Mem *pMem2,
  const CollSeq *pColl,
  u8 *prcErr                      /* If an OOM occurs, set to SQLITE_NOMEM */
){
  if( pMem1->enc==pColl->enc ){
    /* The strings are already in the correct encoding.  Call the
     ** comparison function directly */
    return pColl->xCmp(pColl->pUser,pMem1->n,pMem1->z,pMem2->n,pMem2->z);
  }else{
    int rc;
    const void *v1, *v2;
    Mem c1;
    Mem c2;
    sqlite3VdbeMemInit(&c1, pMem1->db, MEM_Null);
    sqlite3VdbeMemInit(&c2, pMem1->db, MEM_Null);
    sqlite3VdbeMemShallowCopy(&c1, pMem1, MEM_Ephem);
    sqlite3VdbeMemShallowCopy(&c2, pMem2, MEM_Ephem);
    v1 = sqlite3ValueText((sqlite3_value*)&c1, pColl->enc);
    v2 = sqlite3ValueText((sqlite3_value*)&c2, pColl->enc);
    if( (v1==0 || v2==0) ){
      if( prcErr ) *prcErr = SQLITE_NOMEM_BKPT;
      rc = 0;
    }else{
      rc = pColl->xCmp(pColl->pUser, c1.n, v1, c2.n, v2);
    }
    sqlite3VdbeMemReleaseMalloc(&c1);
    sqlite3VdbeMemReleaseMalloc(&c2);
    return rc;
  }
}